

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

int clone_link_configuration
              (role link_role,AMQP_MESSENGER_LINK_CONFIG *dst_config,
              AMQP_MESSENGER_LINK_CONFIG *src_config)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  MAP_HANDLE pMVar3;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,link_role) == 0) {
    iVar1 = mallocAndStrcpy_s(&dst_config->target_suffix,src_config->target_suffix);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0xd0;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"clone_link_configuration",0xcf,1,"Failed copying send_link_target_suffix");
      return 0xd0;
    }
  }
  else {
    iVar1 = mallocAndStrcpy_s(&dst_config->source_suffix,src_config->source_suffix);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"clone_link_configuration",0xd5,1,"Failed copying receive_link_source_suffix");
      }
      destroy_link_configuration(dst_config);
      return 0xd7;
    }
  }
  if (src_config->attach_properties != (MAP_HANDLE)0x0) {
    pMVar3 = Map_Clone(src_config->attach_properties);
    dst_config->attach_properties = pMVar3;
    if (pMVar3 == (MAP_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"clone_link_configuration",0xdc,1,"Failed copying link attach properties");
      }
      destroy_link_configuration(dst_config);
      return 0xde;
    }
  }
  dst_config->snd_settle_mode = src_config->snd_settle_mode;
  dst_config->rcv_settle_mode = src_config->rcv_settle_mode;
  return 0;
}

Assistant:

static int clone_link_configuration(role link_role, AMQP_MESSENGER_LINK_CONFIG* dst_config, const AMQP_MESSENGER_LINK_CONFIG* src_config)
{
    int result;

    if (link_role == role_sender &&
        mallocAndStrcpy_s(&dst_config->target_suffix, src_config->target_suffix) != 0)
    {
        LogError("Failed copying send_link_target_suffix");
        result = MU_FAILURE;
    }
    else if (link_role == role_receiver &&
        mallocAndStrcpy_s(&dst_config->source_suffix, src_config->source_suffix) != 0)
    {
        LogError("Failed copying receive_link_source_suffix");
        destroy_link_configuration(dst_config);
        result = MU_FAILURE;
    }
    else if (src_config->attach_properties != NULL &&
        (dst_config->attach_properties = Map_Clone(src_config->attach_properties)) == NULL)
    {
        LogError("Failed copying link attach properties");
        destroy_link_configuration(dst_config);
        result = MU_FAILURE;
    }
    else
    {
        dst_config->snd_settle_mode = src_config->snd_settle_mode;
        dst_config->rcv_settle_mode = src_config->rcv_settle_mode;

        result = RESULT_OK;
    }

    return result;
}